

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 04_waypoints_online.cpp
# Opt level: O3

int main(void)

{
  pointer __src;
  Result RVar1;
  ostream *poVar2;
  long lVar3;
  undefined8 *puVar4;
  ostringstream *poVar5;
  size_t i;
  byte bVar6;
  OutputParameter<3UL,_ruckig::StandardVector> output;
  InputParameter<3UL,_ruckig::StandardVector> input;
  Ruckig<3UL,_ruckig::StandardVector,_false> otg;
  long *local_1ef0;
  long local_1ee8;
  long local_1ee0 [2];
  OutputParameter<3UL,_ruckig::StandardVector> local_1ed0;
  undefined1 local_1d88 [304];
  pointer local_1c58;
  pointer local_1c50;
  _Storage<double,_true> local_1ac8;
  bool local_1ac0;
  ostringstream local_1ab8 [96];
  undefined1 local_1a58 [16];
  ios_base local_1a48 [264];
  undefined1 local_1940 [6416];
  
  bVar6 = 0;
  ruckig::Ruckig<3UL,_ruckig::StandardVector,_false>::Ruckig<3UL,_0>
            ((Ruckig<3UL,_ruckig::StandardVector,_false> *)local_1940,0.01,10);
  ruckig::InputParameter<3UL,_ruckig::StandardVector>::InputParameter<3UL,_0>
            ((InputParameter<3UL,_ruckig::StandardVector> *)local_1d88);
  local_1ed0.degrees_of_freedom = 3;
  ruckig::Trajectory<3UL,_ruckig::StandardVector>::Trajectory<3UL,_0>(&local_1ed0.trajectory,10);
  local_1ed0.time = 0.0;
  local_1ed0.new_section._0_7_ = 0;
  local_1ed0.new_section._7_1_ = 0;
  local_1ed0.did_section_change = false;
  local_1ed0.new_calculation = false;
  local_1ed0.was_calculation_interrupted = false;
  local_1d88._24_8_ = 0.2;
  local_1d88._32_8_ = 0.0;
  local_1d88._40_8_ = -0.3;
  local_1d88._48_8_ = 0.0;
  local_1d88._56_8_ = 0.2;
  local_1d88._64_8_ = 0.0;
  local_1d88._72_8_ = 0.0;
  local_1d88._80_8_ = 0.6;
  local_1d88._88_8_ = 0.0;
  puVar4 = &DAT_001171f0;
  poVar5 = local_1ab8;
  for (lVar3 = 0xc; lVar3 != 0; lVar3 = lVar3 + -1) {
    *(undefined8 *)poVar5 = *puVar4;
    puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
    poVar5 = poVar5 + ((ulong)bVar6 * -2 + 1) * 8;
  }
  std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>::
  _M_assign_aux<std::array<double,3ul>const*>
            ((vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>> *)&local_1c58,
             local_1ab8,local_1a58);
  local_1d88._96_8_ = 0.5;
  local_1d88._104_8_ = 1.0;
  local_1d88._112_8_ = 0.0;
  local_1d88._120_8_ = 0.2;
  local_1d88._128_8_ = 0.0;
  local_1d88._136_8_ = 0.3;
  local_1d88._144_8_ = 0.0;
  local_1d88._152_8_ = 0.1;
  local_1d88._160_8_ = -0.1;
  local_1d88._168_8_ = 1.0;
  local_1d88._176_8_ = 2.0;
  local_1d88._184_8_ = 1.0;
  local_1d88._192_8_ = 3.0;
  local_1d88._200_8_ = 2.0;
  local_1d88._208_8_ = 2.0;
  local_1d88._216_8_ = 6.0;
  local_1d88._224_8_ = 10.0;
  local_1d88._232_8_ = 20.0;
  if (local_1ac0 == false) {
    local_1ac0 = true;
  }
  local_1ac8._M_value = 500.0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"t | position",0xc);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  while( true ) {
    RVar1 = ruckig::Ruckig<3UL,_ruckig::StandardVector,_false>::update
                      ((Ruckig<3UL,_ruckig::StandardVector,_false> *)local_1940,
                       (InputParameter<3UL,_ruckig::StandardVector> *)local_1d88,&local_1ed0);
    if (RVar1 != Working) break;
    if (local_1ed0.new_calculation == true) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Updated the trajectory:",0x17);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
      std::ostream::put(-0x40);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"  Reached target position in ",0x1d);
      poVar2 = std::ostream::_M_insert<double>(local_1ed0.trajectory.duration);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," [s].",5);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"  Calculation in ",0x11);
      poVar2 = std::ostream::_M_insert<double>(local_1ed0.calculation_duration);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,anon_var_dwarf_193bc,7);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
    }
    poVar2 = std::ostream::_M_insert<double>(local_1ed0.time);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," | ",3);
    std::__cxx11::ostringstream::ostringstream(local_1ab8);
    lVar3 = 0;
    do {
      if (lVar3 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1ab8,", ",2);
      }
      std::ostream::_M_insert<double>(local_1ed0.new_position._M_elems[lVar3]);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_1ab8);
    std::ios_base::~ios_base(local_1a48);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(char *)local_1ef0,local_1ee8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    if (local_1ef0 != local_1ee0) {
      operator_delete(local_1ef0,local_1ee0[0] + 1);
    }
    local_1d88._40_8_ = local_1ed0.new_position._M_elems[2];
    local_1d88._24_8_ = local_1ed0.new_position._M_elems[0];
    local_1d88._32_8_ = local_1ed0.new_position._M_elems[1];
    local_1d88._64_8_ = local_1ed0.new_velocity._M_elems[2];
    local_1d88._48_8_ = local_1ed0.new_velocity._M_elems[0];
    local_1d88._56_8_ = local_1ed0.new_velocity._M_elems[1];
    local_1d88._88_8_ = local_1ed0.new_acceleration._M_elems[2];
    local_1d88._72_8_ = local_1ed0.new_acceleration._M_elems[0];
    local_1d88._80_8_ = local_1ed0.new_acceleration._M_elems[1];
    if (local_1ed0.did_section_change == true) {
      if (local_1c58 != local_1c50) {
        __src = local_1c58 + 1;
        if (__src != local_1c50) {
          memmove(local_1c58,__src,(long)local_1c50 - (long)__src);
        }
        local_1c50 = local_1c50 + -1;
      }
    }
  }
  if (local_1ed0.trajectory.cumulative_times.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1ed0.trajectory.cumulative_times.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1ed0.trajectory.cumulative_times.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1ed0.trajectory.cumulative_times.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1ed0.trajectory.profiles.
      super__Vector_base<std::array<ruckig::Profile,_3UL>,_std::allocator<std::array<ruckig::Profile,_3UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1ed0.trajectory.profiles.
                    super__Vector_base<std::array<ruckig::Profile,_3UL>,_std::allocator<std::array<ruckig::Profile,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1ed0.trajectory.profiles.
                          super__Vector_base<std::array<ruckig::Profile,_3UL>,_std::allocator<std::array<ruckig::Profile,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1ed0.trajectory.profiles.
                          super__Vector_base<std::array<ruckig::Profile,_3UL>,_std::allocator<std::array<ruckig::Profile,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  ruckig::InputParameter<3UL,_ruckig::StandardVector>::~InputParameter
            ((InputParameter<3UL,_ruckig::StandardVector> *)local_1d88);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1940._6376_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1940._6376_8_);
  }
  ruckig::InputParameter<3UL,_ruckig::StandardVector>::~InputParameter
            ((InputParameter<3UL,_ruckig::StandardVector> *)local_1940);
  return 0;
}

Assistant:

int main() {
    const double control_cycle = 0.01;
    const size_t DOFs = 3;
    const size_t max_number_of_waypoints = 10;  // for memory allocation

    // Create instances: the Ruckig OTG as well as input and output parameters
    Ruckig<DOFs> otg(control_cycle, max_number_of_waypoints);
    InputParameter<DOFs> input;
    OutputParameter<DOFs> output(max_number_of_waypoints);

    // Set input parameters
    input.current_position = {0.2, 0.0, -0.3};
    input.current_velocity = {0.0, 0.2, 0.0};
    input.current_acceleration = {0.0, 0.6, 0.0};

    input.intermediate_positions = {
        {1.4, -1.6, 1.0},
        {-0.6, -0.5, 0.4},
        {-0.4, -0.35, 0.0},
        {0.8, 1.8, -0.1}
    };

    input.target_position = {0.5, 1.0, 0.0};
    input.target_velocity = {0.2, 0.0, 0.3};
    input.target_acceleration = {0.0, 0.1, -0.1};

    input.max_velocity = {1.0, 2.0, 1.0};
    input.max_acceleration = {3.0, 2.0, 2.0};
    input.max_jerk = {6.0, 10.0, 20.0};

    input.interrupt_calculation_duration = 500; // [µs]

    std::cout << "t | position" << std::endl;
    double calculation_duration = 0.0;
    while (otg.update(input, output) == Result::Working) {
        if (output.new_calculation) {
            std::cout << "Updated the trajectory:" << std::endl;
            std::cout << "  Reached target position in " << output.trajectory.get_duration() << " [s]." << std::endl;
            std::cout << "  Calculation in " << output.calculation_duration << " [µs]." << std::endl;
        }

        std::cout << output.time << " | " << join(output.new_position) << std::endl;

        output.pass_to_input(input);
    }
}